

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementSpring.cpp
# Opt level: O3

double __thiscall chrono::fea::ChElementSpring::GetCurrentForce(ChElementSpring *this)

{
  pointer psVar1;
  element_type *peVar2;
  element_type *peVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  ulong local_48;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  
  psVar1 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar2 = psVar1[1].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar3 = (psVar1->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  dVar4 = *(double *)&peVar2->field_0x28 - *(double *)&peVar3->field_0x28;
  dVar5 = *(double *)((long)&peVar2->super_ChNodeFEAbase + 0x20) -
          *(double *)((long)&peVar3->super_ChNodeFEAbase + 0x20);
  dVar6 = *(double *)&peVar2->field_0x30 - *(double *)&peVar3->field_0x30;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar5;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar4 * dVar4;
  auVar8 = vfmadd231sd_fma(auVar19,auVar10,auVar10);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar6;
  auVar8 = vfmadd231sd_fma(auVar8,auVar15,auVar15);
  auVar8 = vsqrtsd_avx(auVar8,auVar8);
  bVar9 = 2.2250738585072014e-308 <= auVar8._0_8_;
  dVar18 = 1.0 / auVar8._0_8_;
  (**(code **)(*(long *)&peVar2->super_ChNodeFEAbase + 0x60))(&local_30);
  (**(code **)(*(long *)&((((this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_48);
  psVar1 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_28;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_30;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_48;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_40;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_20;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_38;
  peVar2 = (psVar1->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar3 = psVar1[1].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)&peVar3->field_0x28;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)((long)&peVar3->super_ChNodeFEAbase + 0x20);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)&peVar3->field_0x30;
  auVar7 = vunpcklpd_avx(auVar27,auVar12);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)((long)&peVar2->super_ChNodeFEAbase + 0x20);
  auVar8 = vunpcklpd_avx(auVar26,auVar11);
  auVar10 = vunpcklpd_avx(auVar29,auVar16);
  auVar11 = vunpcklpd_avx(auVar28,auVar20);
  auVar8 = vsubpd_avx(auVar8,auVar11);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)&peVar2->field_0x28;
  auVar11 = vunpcklpd_avx(auVar21,auVar24);
  auVar7 = vsubpd_avx(auVar7,auVar11);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)&peVar2->field_0x30;
  auVar13._0_8_ = auVar7._0_8_ * auVar7._0_8_;
  auVar13._8_8_ = auVar7._8_8_ * auVar7._8_8_;
  auVar7 = vfmadd231pd_fma(auVar13,auVar8,auVar8);
  auVar8 = vunpcklpd_avx(auVar22,auVar25);
  auVar8 = vsubpd_avx(auVar10,auVar8);
  auVar8 = vfmadd231pd_fma(auVar7,auVar8,auVar8);
  auVar10 = vsqrtpd_avx(auVar8);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (ulong)bVar9 * (long)(dVar5 * dVar18) + (ulong)!bVar9 * 0x3ff0000000000000;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(double *)&peVar3->field_0x38 - *(double *)&peVar2->field_0x38;
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       (*(double *)&peVar3->field_0x40 - *(double *)&peVar2->field_0x40) *
       (double)((ulong)bVar9 * (long)(dVar4 * dVar18));
  auVar8 = vfmadd231sd_fma(auVar17,auVar14,auVar8);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (ulong)bVar9 * (long)(dVar6 * dVar18);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(double *)&peVar3->field_0x48 - *(double *)&peVar2->field_0x48;
  auVar7 = vfmadd231sd_fma(auVar8,auVar23,auVar7);
  auVar8 = vhsubpd_avx(auVar10,auVar10);
  return auVar8._0_8_ * this->spring_k + auVar7._0_8_ * this->damper_r;
}

Assistant:

double ChElementSpring::GetCurrentForce() {
	ChVector<> dir = (nodes[1]->GetPos() - nodes[0]->GetPos()).GetNormalized();
	double L_ref = (nodes[1]->GetX0() - nodes[0]->GetX0()).Length();
    double L = (nodes[1]->GetPos() - nodes[0]->GetPos()).Length();
    double L_dt = Vdot((nodes[1]->GetPos_dt() - nodes[0]->GetPos_dt()), dir);
    double internal_Kforce_local = this->spring_k * (L - L_ref);
    double internal_Rforce_local = this->damper_r * L_dt;
	return internal_Kforce_local + internal_Rforce_local;
}